

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::AddSymbol
          (DescriptorIndex *this,string_view symbol)

{
  bool bVar1;
  size_type sVar2;
  LogMessage *pLVar3;
  iterator iter_00;
  char *extraout_RDX;
  anon_unknown_23 *this_00;
  DescriptorIndex *index;
  const_iterator cVar4;
  iterator iVar5;
  undefined1 auVar6 [16];
  string_view sVar7;
  string_view symbol_name;
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*>
  end;
  SymbolCompare local_128;
  SymbolEntry *local_120;
  const_iterator flat_iter;
  undefined1 auStack_d8 [8];
  const_iterator iter;
  LogMessage local_c0;
  Voidify local_a9;
  anon_unknown_23 *local_a8;
  char *pcStack_a0;
  undefined1 local_88 [8];
  string entry_as_string;
  undefined1 local_50 [8];
  SymbolEntry entry;
  DescriptorIndex *this_local;
  string_view symbol_local;
  
  this_00 = (anon_unknown_23 *)symbol._M_len;
  entry.encoded_symbol.field_2._8_8_ = this;
  sVar2 = std::
          vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
          ::size(&this->all_values_);
  local_50._0_4_ = (int)sVar2 + -1;
  entry_as_string.field_2._8_8_ = this_00;
  EncodeString_abi_cxx11_((String *)&entry,this,symbol);
  SymbolEntry::AsString_abi_cxx11_((string *)local_88,(SymbolEntry *)local_50,this);
  sVar7._M_str = extraout_RDX;
  sVar7._M_len = (size_t)symbol._M_str;
  local_a8 = this_00;
  pcStack_a0 = symbol._M_str;
  bVar1 = anon_unknown_23::ValidateSymbolName(this_00,sVar7);
  if (bVar1) {
    cVar4 = protobuf::(anonymous_namespace)::
            FindLastLessOrEqual<absl::lts_20250127::btree_set<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>>,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>
                      (&this->by_symbol_,(SymbolEntry *)local_50);
    auStack_d8 = (undefined1  [8])cVar4.node_;
    iter.node_._0_4_ = cVar4.position_;
    sVar7 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_88);
    iVar5 = absl::lts_20250127::container_internal::
            btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>_>
            ::end((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>_>
                   *)&this->by_symbol_);
    flat_iter._M_current = (SymbolEntry *)iVar5.node_;
    end._12_4_ = 0;
    end.node_ = (btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
                 *)SUB128(iVar5._0_12_,0);
    end.position_ = SUB124(iVar5._0_12_,8);
    index = this;
    bVar1 = CheckForMutualSubsymbols<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,256,false>>const,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_const&,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_const*>,absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,256,false>>,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_const&,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_const*>,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex>
                      (sVar7,(btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*>
                              *)auStack_d8,end,this);
    if (bVar1) {
      local_128.index =
           (DescriptorIndex *)
           absl::lts_20250127::container_internal::
           btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>_>
           ::key_comp((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>_>
                       *)&this->by_symbol_);
      local_120 = (SymbolEntry *)
                  protobuf::(anonymous_namespace)::
                  FindLastLessOrEqual<std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>>,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare>
                            (&this->by_symbol_flat_,(SymbolEntry *)local_50,&local_128);
      auVar6 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_88);
      iter_00 = std::
                vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
                ::end(&this->by_symbol_flat_);
      symbol_name._M_str = (char *)&local_120;
      symbol_name._M_len = auVar6._8_8_;
      bVar1 = CheckForMutualSubsymbols<__gnu_cxx::__normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_const*,std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>>>,__gnu_cxx::__normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry*,std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>>>,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex>
                        (auVar6._0_8_,symbol_name,
                         (__normal_iterator<const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>_>
                          *)iter_00._M_current,
                         (__normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>_>
                          )this,index);
      if (bVar1) {
        cVar4.position_ = (int)iter.node_;
        cVar4.node_ = (btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
                       *)auStack_d8;
        cVar4._12_4_ = 0;
        absl::lts_20250127::container_internal::
        btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>_>
        ::insert(&(this->by_symbol_).
                  super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>_>
                 ,cVar4,(value_type *)local_50);
        symbol_local._M_str._7_1_ = true;
      }
      else {
        symbol_local._M_str._7_1_ = false;
      }
    }
    else {
      symbol_local._M_str._7_1_ = false;
    }
  }
  else {
    absl::lts_20250127::log_internal::LogMessage::LogMessage
              (&local_c0,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database.cc"
               ,0x2e4);
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_c0);
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar3,(char (*) [22])"Invalid symbol name: ");
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar3,(string *)local_88);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_a9,pLVar3);
    absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_c0);
    symbol_local._M_str._7_1_ = false;
  }
  iter.position_ = 1;
  std::__cxx11::string::~string((string *)local_88);
  SymbolEntry::~SymbolEntry((SymbolEntry *)local_50);
  return symbol_local._M_str._7_1_;
}

Assistant:

bool EncodedDescriptorDatabase::DescriptorIndex::AddSymbol(
    absl::string_view symbol) {
  SymbolEntry entry = {static_cast<int>(all_values_.size() - 1),
                       EncodeString(symbol)};
  std::string entry_as_string = entry.AsString(*this);

  // We need to make sure not to violate our map invariant.

  // If the symbol name is invalid it could break our lookup algorithm (which
  // relies on the fact that '.' sorts before all other characters that are
  // valid in symbol names).
  if (!ValidateSymbolName(symbol)) {
    ABSL_LOG(ERROR) << "Invalid symbol name: " << entry_as_string;
    return false;
  }

  auto iter = FindLastLessOrEqual(&by_symbol_, entry);
  if (!CheckForMutualSubsymbols(entry_as_string, &iter, by_symbol_.end(),
                                *this)) {
    return false;
  }

  // Same, but on by_symbol_flat_
  auto flat_iter =
      FindLastLessOrEqual(&by_symbol_flat_, entry, by_symbol_.key_comp());
  if (!CheckForMutualSubsymbols(entry_as_string, &flat_iter,
                                by_symbol_flat_.end(), *this)) {
    return false;
  }

  // OK, no conflicts.

  // Insert the new symbol using the iterator as a hint, the new entry will
  // appear immediately before the one the iterator is pointing at.
  by_symbol_.insert(iter, entry);

  return true;
}